

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::updateFormatSpec(LogFormat *this)

{
  undefined *puVar1;
  char *pcVar2;
  bool bVar3;
  allocator local_4c9;
  string_t local_4c8;
  allocator local_4a1;
  string_t local_4a0;
  allocator local_479;
  string_t local_478;
  allocator local_451;
  string_t local_450;
  allocator local_429;
  string_t local_428;
  allocator local_401;
  string_t local_400;
  allocator local_3d9;
  string_t local_3d8;
  allocator local_3b1;
  string_t local_3b0;
  allocator local_389;
  string_t local_388;
  allocator local_361;
  string_t local_360;
  allocator local_339;
  string_t local_338;
  allocator local_311;
  string_t local_310;
  allocator local_2e9;
  string_t local_2e8;
  allocator local_2c1;
  string_t local_2c0;
  allocator local_299;
  string_t local_298;
  allocator local_271;
  string_t local_270;
  allocator local_249;
  string_t local_248;
  allocator local_221;
  string_t local_220;
  allocator local_1f9;
  string_t local_1f8;
  allocator local_1d1;
  string_t local_1d0;
  allocator local_1a9;
  string_t local_1a8;
  allocator local_181;
  string_t local_180;
  allocator local_159;
  string_t local_158;
  allocator local_131;
  string_t local_130;
  allocator local_109;
  string_t local_108;
  allocator local_e1;
  string_t local_e0;
  allocator local_b9;
  string_t local_b8;
  allocator local_91;
  string_t local_90;
  allocator local_69;
  string_t local_68;
  allocator local_31;
  string_t local_30;
  LogFormat *local_10;
  LogFormat *this_local;
  
  puVar1 = consts::kSeverityLevelFormatSpecifier;
  local_10 = this;
  if (this->m_level == Debug) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,puVar1,&local_31);
    puVar1 = consts::kDebugLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,puVar1,&local_69);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_30,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,puVar1,&local_91);
    pcVar2 = consts::kDebugLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar2,&local_b9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_90,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else if (this->m_level == Info) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,puVar1,&local_e1);
    puVar1 = consts::kInfoLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,puVar1,&local_109);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,puVar1,&local_131);
    puVar1 = consts::kInfoLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,puVar1,&local_159);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  else if (this->m_level == Warning) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,puVar1,&local_181);
    puVar1 = consts::kWarningLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,puVar1,&local_1a9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_180,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,puVar1,&local_1d1);
    puVar1 = consts::kWarningLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,puVar1,&local_1f9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_1d0,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  else if (this->m_level == Error) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,puVar1,&local_221);
    puVar1 = consts::kErrorLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,puVar1,&local_249);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_220,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,puVar1,&local_271);
    pcVar2 = consts::kErrorLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_298,pcVar2,&local_299);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_270,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
  }
  else if (this->m_level == Fatal) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c0,puVar1,&local_2c1);
    puVar1 = consts::kFatalLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,puVar1,&local_2e9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_2c0,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,puVar1,&local_311);
    puVar1 = consts::kFatalLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,puVar1,&local_339);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_310,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
  }
  else if (this->m_level == Verbose) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,puVar1,&local_361);
    pcVar2 = consts::kVerboseLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,pcVar2,&local_389);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_360,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,puVar1,&local_3b1);
    pcVar2 = consts::kVerboseLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d8,pcVar2,&local_3d9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_3b0,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  }
  else if (this->m_level == Trace) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_400,puVar1,&local_401);
    puVar1 = consts::kTraceLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_428,puVar1,&local_429);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_400,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_450,puVar1,&local_451);
    pcVar2 = consts::kTraceLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_478,pcVar2,&local_479);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_450,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
  }
  bVar3 = hasFlag(this,User);
  puVar1 = consts::kCurrentUserFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,puVar1,&local_4a1);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_4a0,&this->m_currentUser);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  bVar3 = hasFlag(this,Host);
  puVar1 = consts::kCurrentHostFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c8,puVar1,&local_4c9);
    utils::Str::replaceFirstWithEscape(&this->m_format,&local_4c8,&this->m_currentHost);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  }
  return;
}

Assistant:

void LogFormat::updateFormatSpec(void) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (m_level == Level::Debug) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kDebugLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kDebugLevelShortLogValue);
  } else if (m_level == Level::Info) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kInfoLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kInfoLevelShortLogValue);
  } else if (m_level == Level::Warning) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kWarningLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kWarningLevelShortLogValue);
  } else if (m_level == Level::Error) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kErrorLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kErrorLevelShortLogValue);
  } else if (m_level == Level::Fatal) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kFatalLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kFatalLevelShortLogValue);
  } else if (m_level == Level::Verbose) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kVerboseLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kVerboseLevelShortLogValue);
  } else if (m_level == Level::Trace) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kTraceLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kTraceLevelShortLogValue);
  }
  if (hasFlag(base::FormatFlags::User)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentUserFormatSpecifier,
        m_currentUser);
  }
  if (hasFlag(base::FormatFlags::Host)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentHostFormatSpecifier,
        m_currentHost);
  }
  // Ignore Level::Global and Level::Unknown
}